

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O1

bool __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::performSolutionPolishing
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  cpp_dec_float<50U,_int,_void> *pcVar1;
  uint *puVar2;
  byte bVar3;
  uint n;
  uint n_00;
  fpclass_type fVar4;
  SPxOut *pSVar5;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar6;
  pointer pnVar7;
  char cVar8;
  undefined8 uVar9;
  int32_t iVar10;
  undefined1 auVar11 [16];
  bool bVar12;
  bool bVar13;
  Status SVar14;
  int iVar15;
  int iVar16;
  cpp_dec_float<50U,_int,_void> *pcVar17;
  Item *in_RCX;
  long lVar18;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *pCVar19;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar20;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *pCVar21;
  long lVar22;
  int i;
  Real RVar23;
  SPxId polishId;
  Verbosity old_verbosity;
  DIdxSet slackcandidates;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  DIdxSet continuousvars;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  origval;
  char local_601;
  DataKey local_600;
  cpp_dec_float<50U,_int,_void> local_5f8;
  DIdxSet local_5c0;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *local_5a0;
  Status *local_598;
  Status *local_590;
  int local_584;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_580;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_548;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4e8;
  fpclass_type local_4e0;
  byte local_4dc;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *local_4d8;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *local_4c8;
  undefined8 uStack_4c0;
  undefined1 local_4b8 [32];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_498;
  fpclass_type local_490;
  bool local_48c;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *local_488;
  undefined1 local_478 [32];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_458;
  fpclass_type local_450;
  bool local_44c;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *local_448;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *local_438;
  undefined8 uStack_430;
  uint local_428 [10];
  DIdxSet local_400;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *local_3e0;
  ulong local_3d8;
  undefined8 uStack_3d0;
  uint local_3c8 [2];
  uint auStack_3c0 [2];
  uint local_3b8 [2];
  undefined8 uStack_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3a8;
  uint local_398 [2];
  uint auStack_390 [2];
  uint local_388 [2];
  undefined8 uStack_380;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_378;
  uint local_368 [2];
  uint auStack_360 [2];
  uint local_358 [2];
  undefined8 uStack_350;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_348;
  cpp_dec_float<50U,_int,_void> local_338;
  cpp_dec_float<50U,_int,_void> local_2f8;
  cpp_dec_float<50U,_int,_void> local_2b8;
  cpp_dec_float<50U,_int,_void> local_278;
  cpp_dec_float<50U,_int,_void> local_238;
  cpp_dec_float<50U,_int,_void> local_1f8;
  cpp_dec_float<50U,_int,_void> local_1b8;
  cpp_dec_float<50U,_int,_void> local_180;
  cpp_dec_float<50U,_int,_void> local_148;
  cpp_dec_float<50U,_int,_void> local_110;
  cpp_dec_float<50U,_int,_void> local_d8;
  uint local_a0 [2];
  uint auStack_98 [2];
  uint local_90 [2];
  uint auStack_88 [2];
  uint local_80 [2];
  int local_78;
  undefined1 local_74;
  fpclass_type local_70;
  int32_t iStack_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined4 local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  bVar12 = false;
  if ((-1 < this->maxIters) &&
     (this->maxIters <=
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).iterCount)) {
    bVar12 = isTimeLimitReached(this,false);
    bVar12 = !bVar12;
  }
  if (((bVar12) || (this->polishObj == POLISH_OFF)) || (SVar14 = status(this), SVar14 != OPTIMAL)) {
    bVar12 = false;
  }
  else {
    local_598 = (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.rowstat.data;
    local_590 = (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data;
    local_600.info = 0;
    local_600.idx = -1;
    local_428[4] = 0;
    local_428[5] = 0;
    local_428[6] = 0;
    local_428[7] = 0;
    local_428[0] = 0;
    local_428[1] = 0;
    local_428[2] = 0;
    local_428[3] = 0;
    local_428[8] = 0;
    local_428[9] = 0;
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x5e])(local_a0,this);
    pSVar5 = this->spxout;
    if ((pSVar5 != (SPxOut *)0x0) && (3 < (int)pSVar5->m_verbosity)) {
      local_5f8.data._M_elems[0] = pSVar5->m_verbosity;
      local_580.m_backend.data._M_elems[0] = 4;
      (*pSVar5->_vptr_SPxOut[2])();
      pSVar5 = this->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar5->m_streams[pSVar5->m_verbosity]," --- perform solution polishing",0x1f);
      in_RCX = (Item *)pSVar5->m_streams;
      pNVar6 = (&(in_RCX->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem)[pSVar5->m_verbosity];
      cVar8 = (char)pNVar6;
      std::ios::widen((char)*(undefined8 *)(*(long *)(pNVar6->val).m_backend.data._M_elems + -0x18)
                      + cVar8);
      std::ostream::put(cVar8);
      std::ostream::flush();
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_5f8);
    }
    if (this->theRep == COLUMN) {
      setType(this,ENTER);
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x76])(this);
      entertol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_5f8,this);
      local_601 = local_5f8.neg;
      iVar15 = local_5f8.exp;
      local_428[8] = local_5f8.data._M_elems[8];
      local_428[9] = local_5f8.data._M_elems[9];
      local_428[4] = local_5f8.data._M_elems[4];
      local_428[5] = local_5f8.data._M_elems[5];
      local_428[6] = local_5f8.data._M_elems[6];
      local_428[7] = local_5f8.data._M_elems[7];
      local_428[0] = local_5f8.data._M_elems[0];
      local_428[1] = local_5f8.data._M_elems[1];
      local_428[2] = local_5f8.data._M_elems[2];
      local_428[3] = local_5f8.data._M_elems[3];
      local_3d8._0_4_ = local_5f8.fpclass;
      local_3d8._4_4_ = local_5f8.prec_elem;
      uStack_3d0 = 0;
      this->instableEnter = false;
      (*this->theratiotester->_vptr_SPxRatioTester[9])
                (this->theratiotester,(ulong)(uint)this->theType);
      local_584 = iVar15;
      if (this->polishObj == POLISH_INTEGRALITY) {
        n = (this->
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum;
        pCVar19 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                   *)(ulong)n;
        n_00 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
        DIdxSet::DIdxSet(&local_5c0,n);
        local_4c8 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                     *)(ulong)n_00;
        DIdxSet::DIdxSet(&local_400,n_00);
        if (0 < (int)n) {
          lVar22 = 0x30;
          pCVar21 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                     *)0x0;
          local_5a0 = pCVar19;
          do {
            if ((local_598[(long)pCVar21] | D_ON_UPPER) == P_ON_UPPER) {
              pnVar7 = (this->theCoPvec->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pnVar20 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          **)((long)(pnVar7->m_backend).data._M_elems + lVar22 + -0x10);
              puVar2 = (uint *)((long)(pnVar7->m_backend).data._M_elems + lVar22 + -0x30);
              local_368 = *(uint (*) [2])puVar2;
              auStack_360 = *(uint (*) [2])(puVar2 + 2);
              puVar2 = (uint *)((long)(pnVar7->m_backend).data._M_elems + lVar22 + -0x20);
              local_358 = *(uint (*) [2])puVar2;
              uStack_350 = *(undefined8 *)(puVar2 + 2);
              fVar4 = *(fpclass_type *)((long)(pnVar7->m_backend).data._M_elems + lVar22 + -8);
              bVar3 = *(byte *)((long)(pnVar7->m_backend).data._M_elems + lVar22 + -4);
              local_438 = *(ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                            **)((long)(pnVar7->m_backend).data._M_elems + lVar22);
              uStack_430 = 0;
              local_348 = pnVar20;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_d8,0,(type *)0x0);
              RVar23 = Tolerances::epsilon((this->
                                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           )._tolerances.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr);
              local_1f8.fpclass = cpp_dec_float_finite;
              local_1f8.prec_elem = 10;
              local_1f8.data._M_elems[0] = 0;
              local_1f8.data._M_elems[1] = 0;
              local_1f8.data._M_elems[2] = 0;
              local_1f8.data._M_elems[3] = 0;
              local_1f8.data._M_elems[4] = 0;
              local_1f8.data._M_elems[5] = 0;
              local_1f8.data._M_elems._24_5_ = 0;
              local_1f8.data._M_elems[7]._1_3_ = 0;
              local_1f8.data._M_elems._32_5_ = 0;
              local_1f8._37_8_ = 0;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)&local_1f8,RVar23);
              local_508._0_4_ = local_368[0];
              local_508._4_4_ = local_368[1];
              uStack_500._0_4_ = auStack_360[0];
              uStack_500._4_4_ = auStack_360[1];
              local_4f8._0_4_ = local_358[0];
              local_4f8._4_4_ = local_358[1];
              uStack_4f0 = uStack_350;
              local_4e8 = local_348;
              local_4d8 = local_438;
              local_548.m_backend.data._M_elems[0] = local_d8.data._M_elems[0];
              local_548.m_backend.data._M_elems[1] = local_d8.data._M_elems[1];
              local_548.m_backend.data._M_elems[2] = local_d8.data._M_elems[2];
              local_548.m_backend.data._M_elems[3] = local_d8.data._M_elems[3];
              local_548.m_backend.data._M_elems[4] = local_d8.data._M_elems[4];
              local_548.m_backend.data._M_elems[5] = local_d8.data._M_elems[5];
              local_548.m_backend.data._M_elems[6] = local_d8.data._M_elems[6];
              local_548.m_backend.data._M_elems[7] = local_d8.data._M_elems[7];
              local_548.m_backend.data._M_elems[8] = local_d8.data._M_elems[8];
              local_548.m_backend.data._M_elems[9] = local_d8.data._M_elems[9];
              local_548.m_backend.exp = local_d8.exp;
              local_548.m_backend.neg = local_d8.neg;
              local_548.m_backend.fpclass = local_d8.fpclass;
              local_548.m_backend.prec_elem = local_d8.prec_elem;
              local_4e0 = fVar4;
              local_4dc = bVar3;
              relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                        (&local_580,(soplex *)&local_508,&local_548,pnVar20);
              local_5f8.data._M_elems[8] = local_580.m_backend.data._M_elems[8];
              local_5f8.data._M_elems[9] = local_580.m_backend.data._M_elems[9];
              local_5f8.data._M_elems[1] = local_580.m_backend.data._M_elems[1];
              local_5f8.data._M_elems[0] = local_580.m_backend.data._M_elems[0];
              local_5f8.data._M_elems[2] = local_580.m_backend.data._M_elems[2];
              local_5f8.data._M_elems[3] = local_580.m_backend.data._M_elems[3];
              local_5f8.exp = local_580.m_backend.exp;
              local_5f8.neg = local_580.m_backend.neg;
              local_5f8.fpclass = local_580.m_backend.fpclass;
              local_5f8.prec_elem = local_580.m_backend.prec_elem;
              if ((local_580.m_backend.neg == true) &&
                 (local_580.m_backend.data._M_elems[0] != 0 || local_580.m_backend.fpclass != 0)) {
                local_5f8.neg = false;
              }
              pCVar19 = local_5a0;
              if (((local_580.m_backend.fpclass != 2) && (local_1f8.fpclass != cpp_dec_float_NaN))
                 && (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              compare(&local_5f8,&local_1f8), pCVar19 = local_5a0, iVar15 < 1)) {
                DIdxSet::addIdx(&local_5c0,(int)pCVar21);
              }
            }
            pCVar21 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                       *)((long)&pCVar21->theitem + 1);
            lVar22 = lVar22 + 0x38;
          } while (pCVar19 != pCVar21);
        }
        in_RCX = (Item *)((ulong)local_4c8 & 0xffffffffffffff00);
        if (0 < (int)local_4c8 && (this->integerVariables).thesize == (int)local_4c8) {
          lVar22 = 0x30;
          pCVar19 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                     *)0x0;
          do {
            if ((local_590[(long)pCVar19] | D_ON_UPPER) == P_ON_UPPER) {
              pnVar20 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .object.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pcVar17 = (cpp_dec_float<50U,_int,_void> *)
                        ((long)(pnVar20->m_backend).data._M_elems + lVar22 + -0x30);
              pcVar1 = (cpp_dec_float<50U,_int,_void> *)
                       ((long)(((this->thePvec->
                                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                       + lVar22 + -0x30);
              local_448 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                           *)0xa00000000;
              local_478._0_16_ = (undefined1  [16])0x0;
              local_478._16_4_ = 0;
              local_478._20_4_ = 0;
              local_478._24_5_ = 0;
              local_478._29_3_ = 0;
              local_458 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)0x0;
              local_450 = cpp_dec_float_finite;
              local_44c = false;
              if (pcVar1 == (cpp_dec_float<50U,_int,_void> *)local_478) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          ((cpp_dec_float<50U,_int,_void> *)local_478,pcVar17);
                if (local_478._0_4_ != 0 || (fpclass_type)local_448 != cpp_dec_float_finite) {
                  local_44c = (bool)(local_44c ^ 1);
                }
              }
              else {
                if (pcVar17 != (cpp_dec_float<50U,_int,_void> *)local_478) {
                  local_458 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                **)((long)(pnVar20->m_backend).data._M_elems + lVar22 + -0x10);
                  local_478._0_16_ = *(undefined1 (*) [16])(pcVar17->data)._M_elems;
                  local_478._16_8_ =
                       *(undefined8 *)((long)(pnVar20->m_backend).data._M_elems + lVar22 + -0x20);
                  uVar9 = *(undefined8 *)((long)(pnVar20->m_backend).data._M_elems + lVar22 + -0x18)
                  ;
                  local_478._24_5_ = (undefined5)uVar9;
                  local_478._29_3_ = (undefined3)((ulong)uVar9 >> 0x28);
                  local_450 = *(fpclass_type *)
                               ((long)(pnVar20->m_backend).data._M_elems + lVar22 + -8);
                  local_44c = *(bool *)((long)(pnVar20->m_backend).data._M_elems + lVar22 + -4);
                  local_448 = *(ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                                **)((long)(pnVar20->m_backend).data._M_elems + lVar22);
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          ((cpp_dec_float<50U,_int,_void> *)local_478,pcVar1);
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_110,0,(type *)0x0);
              RVar23 = Tolerances::epsilon((this->
                                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           )._tolerances.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr);
              local_238.fpclass = cpp_dec_float_finite;
              local_238.prec_elem = 10;
              local_238.data._M_elems[0] = 0;
              local_238.data._M_elems[1] = 0;
              local_238.data._M_elems[2] = 0;
              local_238.data._M_elems[3] = 0;
              local_238.data._M_elems[4] = 0;
              local_238.data._M_elems[5] = 0;
              local_238.data._M_elems._24_5_ = 0;
              local_238.data._M_elems[7]._1_3_ = 0;
              local_238.data._M_elems._32_5_ = 0;
              local_238._37_8_ = 0;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)&local_238,RVar23);
              auVar11 = local_478._0_16_;
              uStack_4f0 = CONCAT35(local_478._29_3_,local_478._24_5_);
              local_508._0_4_ = local_478._0_4_;
              local_508._4_4_ = local_478._4_4_;
              uStack_500._0_4_ = local_478._8_4_;
              uStack_500._4_4_ = local_478._12_4_;
              local_4f8._0_4_ = local_478._16_4_;
              local_4f8._4_4_ = local_478._20_4_;
              local_4e8 = local_458;
              local_4e0 = local_450;
              local_4dc = local_44c;
              local_4d8 = local_448;
              local_548.m_backend.data._M_elems[0] = local_110.data._M_elems[0];
              local_548.m_backend.data._M_elems[1] = local_110.data._M_elems[1];
              local_548.m_backend.data._M_elems[2] = local_110.data._M_elems[2];
              local_548.m_backend.data._M_elems[3] = local_110.data._M_elems[3];
              local_548.m_backend.data._M_elems[4] = local_110.data._M_elems[4];
              local_548.m_backend.data._M_elems[5] = local_110.data._M_elems[5];
              local_548.m_backend.data._M_elems[6] = local_110.data._M_elems[6];
              local_548.m_backend.data._M_elems[7] = local_110.data._M_elems[7];
              local_548.m_backend.data._M_elems[8] = local_110.data._M_elems[8];
              local_548.m_backend.data._M_elems[9] = local_110.data._M_elems[9];
              local_548.m_backend.exp = local_110.exp;
              local_548.m_backend.neg = local_110.neg;
              local_548.m_backend.fpclass = local_110.fpclass;
              local_548.m_backend.prec_elem = local_110.prec_elem;
              local_478._0_16_ = auVar11;
              relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                        (&local_580,(soplex *)&local_508,&local_548,pnVar20);
              local_5f8.data._M_elems[8] = local_580.m_backend.data._M_elems[8];
              local_5f8.data._M_elems[9] = local_580.m_backend.data._M_elems[9];
              local_5f8.data._M_elems[1] = local_580.m_backend.data._M_elems[1];
              local_5f8.data._M_elems[0] = local_580.m_backend.data._M_elems[0];
              local_5f8.data._M_elems[2] = local_580.m_backend.data._M_elems[2];
              local_5f8.data._M_elems[3] = local_580.m_backend.data._M_elems[3];
              local_5f8.exp = local_580.m_backend.exp;
              local_5f8.neg = local_580.m_backend.neg;
              local_5f8.fpclass = local_580.m_backend.fpclass;
              local_5f8.prec_elem = local_580.m_backend.prec_elem;
              in_RCX = (Item *)(local_580.m_backend._48_8_ & 0xffffffff);
              if ((local_580.m_backend.neg == true) &&
                 (local_580.m_backend.data._M_elems[0] != 0 || local_580.m_backend.fpclass != 0)) {
                local_5f8.neg = false;
              }
              if (((local_580.m_backend.fpclass != 2) && (local_238.fpclass != cpp_dec_float_NaN))
                 && ((iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                               compare(&local_5f8,&local_238), iVar15 < 1 &&
                     ((this->integerVariables).data[(long)pCVar19] == 0)))) {
                DIdxSet::addIdx(&local_400,(int)pCVar19);
              }
            }
            pCVar19 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                       *)((long)&pCVar19->theitem + 1);
            lVar22 = lVar22 + 0x38;
          } while (local_4c8 != pCVar19);
        }
        do {
          lVar22 = (long)local_5c0.super_IdxSet.num;
          if ((lVar22 < 1) || (bVar12)) {
            iVar15 = 0;
          }
          else {
            iVar15 = 0;
            do {
              local_600 = (DataKey)coId(this,local_5c0.super_IdxSet.idx[lVar22 + -1]);
              bVar13 = enter(this,(SPxId *)&local_600,true);
              (*(this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._vptr_ClassArray[0x88])(this);
              if (bVar13) {
                iVar15 = iVar15 + 1;
                lVar18 = (long)local_5c0.super_IdxSet.num;
                local_5c0.super_IdxSet.num = local_5c0.super_IdxSet.num + -1;
                in_RCX = (Item *)(ulong)(uint)local_5c0.super_IdxSet.idx[lVar18 + -1];
                local_5c0.super_IdxSet.idx[lVar22 + -1] = local_5c0.super_IdxSet.idx[lVar18 + -1];
                if ((-1 < this->maxIters) &&
                   (this->maxIters <=
                    (this->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).iterCount)) {
                  bVar12 = true;
                }
              }
              bVar13 = isTimeLimitReached(this,false);
              if (bVar13) {
                bVar12 = true;
              }
            } while ((1 < lVar22) && (lVar22 = lVar22 + -1, !bVar12));
          }
          lVar22 = (long)local_400.super_IdxSet.num;
          if (0 < lVar22) {
            while (!bVar12) {
              local_600 = (DataKey)id(this,local_400.super_IdxSet.idx[lVar22 + -1]);
              bVar13 = enter(this,(SPxId *)&local_600,true);
              (*(this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._vptr_ClassArray[0x88])(this);
              if (bVar13) {
                iVar15 = iVar15 + 1;
                lVar18 = (long)local_400.super_IdxSet.num;
                local_400.super_IdxSet.num = local_400.super_IdxSet.num + -1;
                in_RCX = (Item *)(ulong)(uint)local_400.super_IdxSet.idx[lVar18 + -1];
                local_400.super_IdxSet.idx[lVar22 + -1] = local_400.super_IdxSet.idx[lVar18 + -1];
                if ((-1 < this->maxIters) &&
                   (this->maxIters <=
                    (this->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).iterCount)) {
                  bVar12 = true;
                }
              }
              bVar13 = isTimeLimitReached(this,false);
              if (bVar13) {
                bVar12 = true;
              }
              if (lVar22 < 2) break;
              lVar22 = lVar22 + -1;
            }
          }
          if (iVar15 == 0) {
            bVar12 = true;
          }
          this->polishCount = this->polishCount + iVar15;
        } while (!bVar12);
        DIdxSet::~DIdxSet(&local_400);
      }
      else {
        DIdxSet::DIdxSet(&local_5c0,(this->thecovectors->set).thenum);
        if (0 < (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thenum) {
          lVar22 = 0;
          lVar18 = 0;
          do {
            if ((local_590[lVar18] | D_ON_UPPER) == P_ON_UPPER) {
              pnVar20 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .object.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pcVar1 = (cpp_dec_float<50U,_int,_void> *)
                       ((long)(pnVar20->m_backend).data._M_elems + lVar22);
              pcVar17 = (cpp_dec_float<50U,_int,_void> *)
                        ((long)(((this->thePvec->
                                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                               _M_elems + lVar22);
              local_488 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                           *)0xa00000000;
              local_4b8._0_16_ = (undefined1  [16])0x0;
              local_4b8._16_4_ = 0;
              local_4b8._20_4_ = 0;
              local_4b8._24_5_ = 0;
              local_4b8._29_3_ = 0;
              local_498 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)0x0;
              local_490 = cpp_dec_float_finite;
              local_48c = false;
              if (pcVar17 == (cpp_dec_float<50U,_int,_void> *)local_4b8) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          ((cpp_dec_float<50U,_int,_void> *)local_4b8,pcVar1);
                if (local_4b8._0_4_ != 0 || (fpclass_type)local_488 != cpp_dec_float_finite) {
                  local_48c = (bool)(local_48c ^ 1);
                }
              }
              else {
                if (pcVar1 != (cpp_dec_float<50U,_int,_void> *)local_4b8) {
                  local_498 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                **)((pcVar1->data)._M_elems + 8);
                  local_4b8._0_16_ = *(undefined1 (*) [16])(pcVar1->data)._M_elems;
                  local_4b8._16_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 4);
                  uVar9 = *(undefined8 *)((pcVar1->data)._M_elems + 6);
                  local_4b8._24_5_ = (undefined5)uVar9;
                  local_4b8._29_3_ = (undefined3)((ulong)uVar9 >> 0x28);
                  local_490 = *(fpclass_type *)((long)(&(pnVar20->m_backend).data + 1) + lVar22);
                  local_48c = *(bool *)((long)(&(pnVar20->m_backend).data + 1) + lVar22 + 4);
                  local_488 = *(ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                                **)((long)(&(pnVar20->m_backend).data + 1) + lVar22 + 8);
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          ((cpp_dec_float<50U,_int,_void> *)local_4b8,pcVar17);
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_148,0,(type *)0x0);
              RVar23 = Tolerances::epsilon((this->
                                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           )._tolerances.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr);
              local_278.fpclass = cpp_dec_float_finite;
              local_278.prec_elem = 10;
              local_278.data._M_elems[0] = 0;
              local_278.data._M_elems[1] = 0;
              local_278.data._M_elems[2] = 0;
              local_278.data._M_elems[3] = 0;
              local_278.data._M_elems[4] = 0;
              local_278.data._M_elems[5] = 0;
              local_278.data._M_elems._24_5_ = 0;
              local_278.data._M_elems[7]._1_3_ = 0;
              local_278.data._M_elems._32_5_ = 0;
              local_278._37_8_ = 0;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)&local_278,RVar23);
              auVar11 = local_4b8._0_16_;
              uStack_4f0 = CONCAT35(local_4b8._29_3_,local_4b8._24_5_);
              local_508._0_4_ = local_4b8._0_4_;
              local_508._4_4_ = local_4b8._4_4_;
              uStack_500._0_4_ = local_4b8._8_4_;
              uStack_500._4_4_ = local_4b8._12_4_;
              local_4f8._0_4_ = local_4b8._16_4_;
              local_4f8._4_4_ = local_4b8._20_4_;
              local_4e8 = local_498;
              local_4e0 = local_490;
              local_4dc = local_48c;
              local_4d8 = local_488;
              local_548.m_backend.data._M_elems[0] = local_148.data._M_elems[0];
              local_548.m_backend.data._M_elems[1] = local_148.data._M_elems[1];
              local_548.m_backend.data._M_elems[2] = local_148.data._M_elems[2];
              local_548.m_backend.data._M_elems[3] = local_148.data._M_elems[3];
              local_548.m_backend.data._M_elems[4] = local_148.data._M_elems[4];
              local_548.m_backend.data._M_elems[5] = local_148.data._M_elems[5];
              local_548.m_backend.data._M_elems[6] = local_148.data._M_elems[6];
              local_548.m_backend.data._M_elems[7] = local_148.data._M_elems[7];
              local_548.m_backend.data._M_elems[8] = local_148.data._M_elems[8];
              local_548.m_backend.data._M_elems[9] = local_148.data._M_elems[9];
              local_548.m_backend.exp = local_148.exp;
              local_548.m_backend.neg = local_148.neg;
              local_548.m_backend.fpclass = local_148.fpclass;
              local_548.m_backend.prec_elem = local_148.prec_elem;
              local_4b8._0_16_ = auVar11;
              relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                        (&local_580,(soplex *)&local_508,&local_548,pnVar20);
              local_5f8.data._M_elems[8] = local_580.m_backend.data._M_elems[8];
              local_5f8.data._M_elems[9] = local_580.m_backend.data._M_elems[9];
              local_5f8.data._M_elems[1] = local_580.m_backend.data._M_elems[1];
              local_5f8.data._M_elems[0] = local_580.m_backend.data._M_elems[0];
              local_5f8.data._M_elems[2] = local_580.m_backend.data._M_elems[2];
              local_5f8.data._M_elems[3] = local_580.m_backend.data._M_elems[3];
              local_5f8.exp = local_580.m_backend.exp;
              local_5f8.neg = local_580.m_backend.neg;
              local_5f8.fpclass = local_580.m_backend.fpclass;
              local_5f8.prec_elem = local_580.m_backend.prec_elem;
              in_RCX = (Item *)(local_580.m_backend._48_8_ & 0xffffffff);
              if ((local_580.m_backend.neg == true) &&
                 (local_580.m_backend.data._M_elems[0] != 0 || local_580.m_backend.fpclass != 0)) {
                local_5f8.neg = false;
              }
              if (((local_580.m_backend.fpclass != 2) && (local_278.fpclass != cpp_dec_float_NaN))
                 && (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              compare(&local_5f8,&local_278), iVar15 < 1)) {
                DIdxSet::addIdx(&local_5c0,(int)lVar18);
              }
            }
            lVar18 = lVar18 + 1;
            lVar22 = lVar22 + 0x38;
          } while (lVar18 < (this->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .
                            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .set.thenum);
        }
        do {
          lVar22 = (long)local_5c0.super_IdxSet.num;
          if ((lVar22 < 1) || (bVar12)) {
            iVar15 = 0;
          }
          else {
            iVar15 = 0;
            do {
              local_600 = (DataKey)id(this,local_5c0.super_IdxSet.idx[lVar22 + -1]);
              bVar13 = enter(this,(SPxId *)&local_600,true);
              (*(this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._vptr_ClassArray[0x88])(this);
              if (bVar13) {
                iVar15 = iVar15 + 1;
                lVar18 = (long)local_5c0.super_IdxSet.num;
                local_5c0.super_IdxSet.num = local_5c0.super_IdxSet.num + -1;
                in_RCX = (Item *)(ulong)(uint)local_5c0.super_IdxSet.idx[lVar18 + -1];
                local_5c0.super_IdxSet.idx[lVar22 + -1] = local_5c0.super_IdxSet.idx[lVar18 + -1];
                if ((-1 < this->maxIters) &&
                   (this->maxIters <=
                    (this->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).iterCount)) {
                  bVar12 = true;
                }
              }
              bVar13 = isTimeLimitReached(this,false);
              if (bVar13) {
                bVar12 = true;
              }
            } while ((1 < lVar22) && (lVar22 = lVar22 + -1, !bVar12));
          }
          if (iVar15 == 0) {
            bVar12 = true;
          }
          this->polishCount = this->polishCount + iVar15;
        } while (!bVar12);
      }
    }
    else {
      local_438 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                   *)&(this->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.colstat.data;
      setType(this,LEAVE);
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x76])(this);
      leavetol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_5f8,this);
      local_428[8] = local_5f8.data._M_elems[8];
      local_428[9] = local_5f8.data._M_elems[9];
      local_428[4] = local_5f8.data._M_elems[4];
      local_428[5] = local_5f8.data._M_elems[5];
      local_428[6] = local_5f8.data._M_elems[6];
      local_428[7] = local_5f8.data._M_elems[7];
      local_428[0] = local_5f8.data._M_elems[0];
      local_428[1] = local_5f8.data._M_elems[1];
      local_428[2] = local_5f8.data._M_elems[2];
      local_428[3] = local_5f8.data._M_elems[3];
      local_584 = local_5f8.exp;
      local_601 = local_5f8.neg;
      local_3d8._0_4_ = local_5f8.fpclass;
      local_3d8._4_4_ = local_5f8.prec_elem;
      uStack_3d0 = 0;
      this->instableLeave = false;
      (*this->theratiotester->_vptr_SPxRatioTester[9])
                (this->theratiotester,(ulong)(uint)this->theType);
      local_590 = (Status *)
                  CONCAT44(local_590._4_4_,
                           (this->
                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .
                           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .set.thenum);
      iVar15 = (this->integerVariables).thesize;
      local_598 = (Status *)CONCAT44(local_598._4_4_,iVar15);
      if (this->polishObj == POLISH_INTEGRALITY) {
        DIdxSet::DIdxSet(&local_5c0,(this->thecovectors->set).thenum);
        if (0 < (this->thecovectors->set).thenum) {
          local_5a0 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                       *)&(this->
                          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).thedesc.rowstat.data;
          local_3e0 = &(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set;
          lVar22 = 6;
          lVar18 = 0;
          do {
            local_600 = (this->
                        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).theBaseId.data[lVar18].super_DataKey;
            if (local_600.info < 0) {
              iVar16 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::number(&this->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ,(SPxId *)&local_600);
              pCVar19 = local_5a0;
LAB_0026477a:
              in_RCX = pCVar19->theitem;
              if ((*(uint *)((long)&(in_RCX->data).
                                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .m_elem + (long)iVar16 * 4) & 0xfffffffd) == 0xfffffffc) {
                pnVar7 = (this->theFvec->
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                pnVar20 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            **)((pnVar7->m_backend).data._M_elems + lVar22 * 2U + 0xfffffffffffffffc
                               );
                puVar2 = (pnVar7->m_backend).data._M_elems + lVar22 * 2U + 0xfffffffffffffff4;
                local_398 = *(uint (*) [2])puVar2;
                auStack_390 = *(uint (*) [2])(puVar2 + 2);
                puVar2 = (pnVar7->m_backend).data._M_elems + lVar22 * 2U + 0xfffffffffffffff8;
                local_388 = *(uint (*) [2])puVar2;
                uStack_380 = *(undefined8 *)(puVar2 + 2);
                fVar4 = (pnVar7->m_backend).data._M_elems[lVar22 * 2U + 0xfffffffffffffffe];
                iVar10 = (pnVar7->m_backend).data._M_elems[lVar22 * 2U + 0xffffffffffffffff];
                local_4c8 = *(ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                              **)((pnVar7->m_backend).data._M_elems + lVar22 * 2);
                uStack_4c0 = 0;
                local_378 = pnVar20;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<long_long>(&local_180,0,(type *)0x0);
                RVar23 = Tolerances::epsilon((this->
                                             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             )._tolerances.
                                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr);
                local_2b8.fpclass = cpp_dec_float_finite;
                local_2b8.prec_elem = 10;
                local_2b8.data._M_elems[0] = 0;
                local_2b8.data._M_elems[1] = 0;
                local_2b8.data._M_elems[2] = 0;
                local_2b8.data._M_elems[3] = 0;
                local_2b8.data._M_elems[4] = 0;
                local_2b8.data._M_elems[5] = 0;
                local_2b8.data._M_elems._24_5_ = 0;
                local_2b8.data._M_elems[7]._1_3_ = 0;
                local_2b8.data._M_elems._32_5_ = 0;
                local_2b8._37_8_ = 0;
                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                          ((cpp_dec_float<50u,int,void> *)&local_2b8,RVar23);
                local_508._0_4_ = local_398[0];
                local_508._4_4_ = local_398[1];
                uStack_500._0_4_ = auStack_390[0];
                uStack_500._4_4_ = auStack_390[1];
                local_4f8._0_4_ = local_388[0];
                local_4f8._4_4_ = local_388[1];
                uStack_4f0 = uStack_380;
                local_4e8 = local_378;
                local_4d8 = local_4c8;
                local_548.m_backend.data._M_elems[0] = local_180.data._M_elems[0];
                local_548.m_backend.data._M_elems[1] = local_180.data._M_elems[1];
                local_548.m_backend.data._M_elems[2] = local_180.data._M_elems[2];
                local_548.m_backend.data._M_elems[3] = local_180.data._M_elems[3];
                local_548.m_backend.data._M_elems[4] = local_180.data._M_elems[4];
                local_548.m_backend.data._M_elems[5] = local_180.data._M_elems[5];
                local_548.m_backend.data._M_elems[6] = local_180.data._M_elems[6];
                local_548.m_backend.data._M_elems[7] = local_180.data._M_elems[7];
                local_548.m_backend.data._M_elems[8] = local_180.data._M_elems[8];
                local_548.m_backend.data._M_elems[9] = local_180.data._M_elems[9];
                local_548.m_backend.exp = local_180.exp;
                local_548.m_backend.neg = local_180.neg;
                local_548.m_backend.fpclass = local_180.fpclass;
                local_548.m_backend.prec_elem = local_180.prec_elem;
                local_4e0 = fVar4;
                local_4dc = (byte)iVar10;
                relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                          (&local_580,(soplex *)&local_508,&local_548,pnVar20);
                local_5f8.data._M_elems[8] = local_580.m_backend.data._M_elems[8];
                local_5f8.data._M_elems[9] = local_580.m_backend.data._M_elems[9];
                local_5f8.data._M_elems[1] = local_580.m_backend.data._M_elems[1];
                local_5f8.data._M_elems[0] = local_580.m_backend.data._M_elems[0];
                local_5f8.data._M_elems[2] = local_580.m_backend.data._M_elems[2];
                local_5f8.data._M_elems[3] = local_580.m_backend.data._M_elems[3];
                local_5f8.exp = local_580.m_backend.exp;
                local_5f8.neg = local_580.m_backend.neg;
                local_5f8.fpclass = local_580.m_backend.fpclass;
                local_5f8.prec_elem = local_580.m_backend.prec_elem;
                in_RCX = (Item *)(local_580.m_backend._48_8_ & 0xffffffff);
                if ((local_580.m_backend.neg == true) &&
                   (local_580.m_backend.data._M_elems[0] != 0 || local_580.m_backend.fpclass != 0))
                {
                  local_5f8.neg = false;
                }
                if ((local_580.m_backend.fpclass == 2) || (local_2b8.fpclass == cpp_dec_float_NaN))
                {
                  iVar15 = (int)local_598;
                }
                else {
                  iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (&local_5f8,&local_2b8);
                  iVar15 = (int)local_598;
                  if (iVar16 < 1) {
                    DIdxSet::addIdx(&local_5c0,(int)lVar18);
                  }
                }
              }
            }
            else if (iVar15 == (int)local_590) {
              SPxColId::SPxColId((SPxColId *)&local_5f8,(SPxId *)&local_600);
              iVar16 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                       ::number(local_3e0,(DataKey *)&local_5f8);
              in_RCX = (Item *)(this->integerVariables).data;
              if (*(int *)((long)&(in_RCX->data).
                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .m_elem + (long)iVar16 * 4) != 1) {
                iVar16 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ::number(&this->
                                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ,(SPxId *)&local_600);
                pCVar19 = local_438;
                goto LAB_0026477a;
              }
            }
            lVar18 = lVar18 + 1;
            lVar22 = lVar22 + 7;
          } while (lVar18 < (this->thecovectors->set).thenum);
        }
        do {
          lVar22 = (long)local_5c0.super_IdxSet.num;
          if ((lVar22 < 1) || (bVar12)) {
            iVar15 = 0;
          }
          else {
            iVar15 = 0;
            do {
              bVar13 = leave(this,local_5c0.super_IdxSet.idx[lVar22 + -1],true);
              (*(this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._vptr_ClassArray[0x88])(this);
              if (bVar13) {
                iVar15 = iVar15 + 1;
                lVar18 = (long)local_5c0.super_IdxSet.num;
                local_5c0.super_IdxSet.num = local_5c0.super_IdxSet.num + -1;
                in_RCX = (Item *)(ulong)(uint)local_5c0.super_IdxSet.idx[lVar18 + -1];
                local_5c0.super_IdxSet.idx[lVar22 + -1] = local_5c0.super_IdxSet.idx[lVar18 + -1];
                if ((-1 < this->maxIters) &&
                   (this->maxIters <=
                    (this->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).iterCount)) {
                  bVar12 = true;
                }
              }
              bVar13 = isTimeLimitReached(this,false);
              if (bVar13) {
                bVar12 = true;
              }
            } while ((1 < lVar22) && (lVar22 = lVar22 + -1, !bVar12));
          }
          if (iVar15 == 0) {
            bVar12 = true;
          }
          this->polishCount = this->polishCount + iVar15;
        } while (!bVar12);
      }
      else {
        DIdxSet::DIdxSet(&local_5c0,(this->thecovectors->set).thenum);
        if (0 < (this->thecovectors->set).thenum) {
          local_5a0 = &(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set;
          lVar22 = 0x18;
          lVar18 = 0;
          do {
            local_600 = (this->
                        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).theBaseId.data[lVar18].super_DataKey;
            if (-1 < local_600.info) {
              if (iVar15 == (int)local_590) {
                SPxColId::SPxColId((SPxColId *)&local_5f8,(SPxId *)&local_600);
                iVar16 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                         ::number(local_5a0,(DataKey *)&local_5f8);
                in_RCX = (Item *)(this->integerVariables).data;
                if (*(int *)((long)&(in_RCX->data).
                                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .m_elem + (long)iVar16 * 4) == 0) goto LAB_0026516b;
              }
              if ((*(uint *)((long)&(local_438->theitem->data).
                                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .m_elem + lVar18 * 4) & 0xfffffffd) == 0xfffffffc) {
                pnVar7 = (this->theFvec->
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                pnVar20 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            **)((long)(pnVar7->m_backend).data._M_elems + lVar22 * 2 + -0x10);
                puVar2 = (uint *)((long)(pnVar7->m_backend).data._M_elems + lVar22 * 2 + -0x30);
                local_3c8 = *(uint (*) [2])puVar2;
                auStack_3c0 = *(uint (*) [2])(puVar2 + 2);
                puVar2 = (uint *)((long)(pnVar7->m_backend).data._M_elems + lVar22 * 2 + -0x20);
                local_3b8 = *(uint (*) [2])puVar2;
                uStack_3b0 = *(undefined8 *)(puVar2 + 2);
                fVar4 = *(fpclass_type *)((long)(pnVar7->m_backend).data._M_elems + lVar22 * 2 + -8)
                ;
                bVar3 = *(byte *)((long)(pnVar7->m_backend).data._M_elems + lVar22 * 2 + -4);
                local_4c8 = *(ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                              **)((long)(pnVar7->m_backend).data._M_elems + lVar22 * 2);
                uStack_4c0 = 0;
                local_3a8 = pnVar20;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<long_long>(&local_1b8,0,(type *)0x0);
                RVar23 = Tolerances::epsilon((this->
                                             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             )._tolerances.
                                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr);
                local_2f8.fpclass = cpp_dec_float_finite;
                local_2f8.prec_elem = 10;
                local_2f8.data._M_elems[0] = 0;
                local_2f8.data._M_elems[1] = 0;
                local_2f8.data._M_elems[2] = 0;
                local_2f8.data._M_elems[3] = 0;
                local_2f8.data._M_elems[4] = 0;
                local_2f8.data._M_elems[5] = 0;
                local_2f8.data._M_elems._24_5_ = 0;
                local_2f8.data._M_elems[7]._1_3_ = 0;
                local_2f8.data._M_elems._32_5_ = 0;
                local_2f8._37_8_ = 0;
                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                          ((cpp_dec_float<50u,int,void> *)&local_2f8,RVar23);
                local_508._0_4_ = local_3c8[0];
                local_508._4_4_ = local_3c8[1];
                uStack_500._0_4_ = auStack_3c0[0];
                uStack_500._4_4_ = auStack_3c0[1];
                local_4f8._0_4_ = local_3b8[0];
                local_4f8._4_4_ = local_3b8[1];
                uStack_4f0 = uStack_3b0;
                local_4e8 = local_3a8;
                local_4d8 = local_4c8;
                local_548.m_backend.data._M_elems[0] = local_1b8.data._M_elems[0];
                local_548.m_backend.data._M_elems[1] = local_1b8.data._M_elems[1];
                local_548.m_backend.data._M_elems[2] = local_1b8.data._M_elems[2];
                local_548.m_backend.data._M_elems[3] = local_1b8.data._M_elems[3];
                local_548.m_backend.data._M_elems[4] = local_1b8.data._M_elems[4];
                local_548.m_backend.data._M_elems[5] = local_1b8.data._M_elems[5];
                local_548.m_backend.data._M_elems[6] = local_1b8.data._M_elems[6];
                local_548.m_backend.data._M_elems[7] = local_1b8.data._M_elems[7];
                local_548.m_backend.data._M_elems[8] = local_1b8.data._M_elems[8];
                local_548.m_backend.data._M_elems[9] = local_1b8.data._M_elems[9];
                local_548.m_backend.exp = local_1b8.exp;
                local_548.m_backend.neg = local_1b8.neg;
                local_548.m_backend.fpclass = local_1b8.fpclass;
                local_548.m_backend.prec_elem = local_1b8.prec_elem;
                local_4e0 = fVar4;
                local_4dc = bVar3;
                relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                          (&local_580,(soplex *)&local_508,&local_548,pnVar20);
                local_5f8.data._M_elems[8] = local_580.m_backend.data._M_elems[8];
                local_5f8.data._M_elems[9] = local_580.m_backend.data._M_elems[9];
                local_5f8.data._M_elems[1] = local_580.m_backend.data._M_elems[1];
                local_5f8.data._M_elems[0] = local_580.m_backend.data._M_elems[0];
                local_5f8.data._M_elems[2] = local_580.m_backend.data._M_elems[2];
                local_5f8.data._M_elems[3] = local_580.m_backend.data._M_elems[3];
                local_5f8.exp = local_580.m_backend.exp;
                local_5f8.neg = local_580.m_backend.neg;
                local_5f8.fpclass = local_580.m_backend.fpclass;
                local_5f8.prec_elem = local_580.m_backend.prec_elem;
                in_RCX = (Item *)(local_580.m_backend._48_8_ & 0xffffffff);
                if ((local_580.m_backend.neg == true) &&
                   (local_580.m_backend.data._M_elems[0] != 0 || local_580.m_backend.fpclass != 0))
                {
                  local_5f8.neg = false;
                }
                if ((local_580.m_backend.fpclass == 2) || (local_2f8.fpclass == cpp_dec_float_NaN))
                {
                  iVar15 = (int)local_598;
                }
                else {
                  iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (&local_5f8,&local_2f8);
                  iVar15 = (int)local_598;
                  if (iVar16 < 1) {
                    DIdxSet::addIdx(&local_5c0,(int)lVar18);
                  }
                }
              }
            }
LAB_0026516b:
            lVar18 = lVar18 + 1;
            lVar22 = lVar22 + 0x1c;
          } while (lVar18 < (this->thecovectors->set).thenum);
        }
        do {
          lVar22 = (long)local_5c0.super_IdxSet.num;
          if ((lVar22 < 1) || (bVar12)) {
            iVar15 = 0;
          }
          else {
            iVar15 = 0;
            do {
              bVar13 = leave(this,local_5c0.super_IdxSet.idx[lVar22 + -1],true);
              (*(this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._vptr_ClassArray[0x88])(this);
              if (bVar13) {
                iVar15 = iVar15 + 1;
                lVar18 = (long)local_5c0.super_IdxSet.num;
                local_5c0.super_IdxSet.num = local_5c0.super_IdxSet.num + -1;
                in_RCX = (Item *)(ulong)(uint)local_5c0.super_IdxSet.idx[lVar18 + -1];
                local_5c0.super_IdxSet.idx[lVar22 + -1] = local_5c0.super_IdxSet.idx[lVar18 + -1];
                if ((-1 < this->maxIters) &&
                   (this->maxIters <=
                    (this->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).iterCount)) {
                  bVar12 = true;
                }
              }
              bVar13 = isTimeLimitReached(this,false);
              if (bVar13) {
                bVar12 = true;
              }
            } while ((1 < lVar22) && (lVar22 = lVar22 + -1, !bVar12));
          }
          if (iVar15 == 0) {
            bVar12 = true;
          }
          this->polishCount = this->polishCount + iVar15;
        } while (!bVar12);
      }
    }
    DIdxSet::~DIdxSet(&local_5c0);
    iVar15 = local_584;
    pSVar5 = this->spxout;
    if ((pSVar5 != (SPxOut *)0x0) && (2 < (int)pSVar5->m_verbosity)) {
      local_5f8.data._M_elems[0] = pSVar5->m_verbosity;
      local_580.m_backend.data._M_elems[0] = 3;
      (*pSVar5->_vptr_SPxOut[2])();
      pSVar5 = this->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar5->m_streams[pSVar5->m_verbosity]," --- finished solution polishing (",0x22);
      std::ostream::operator<<((ostream *)pSVar5->m_streams[pSVar5->m_verbosity],this->polishCount);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar5->m_streams[pSVar5->m_verbosity]," pivots)",8);
      in_RCX = (Item *)pSVar5->m_streams;
      pNVar6 = (&(in_RCX->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem)[pSVar5->m_verbosity];
      cVar8 = (char)pNVar6;
      std::ios::widen((char)*(undefined8 *)(*(long *)(pNVar6->val).m_backend.data._M_elems + -0x18)
                      + cVar8);
      std::ostream::put(cVar8);
      std::ostream::flush();
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_5f8);
    }
    if ((this->
        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).thestatus != OPTIMAL) {
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thestatus = OPTIMAL;
    }
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x5e])(&local_68,this);
    local_548.m_backend.data._M_elems[8] = local_80[0];
    local_548.m_backend.data._M_elems[9] = local_80[1];
    local_548.m_backend.data._M_elems[4] = local_90[0];
    local_548.m_backend.data._M_elems[5] = local_90[1];
    local_548.m_backend.data._M_elems[6] = auStack_88[0];
    local_548.m_backend.data._M_elems[7] = auStack_88[1];
    local_548.m_backend.data._M_elems[0] = local_a0[0];
    local_548.m_backend.data._M_elems[1] = local_a0[1];
    local_548.m_backend.data._M_elems[2] = auStack_98[0];
    local_548.m_backend.data._M_elems[3] = auStack_98[1];
    local_338.data._M_elems[0] = local_428[0];
    local_338.data._M_elems[1] = local_428[1];
    local_338.data._M_elems[2] = local_428[2];
    local_338.data._M_elems[3] = local_428[3];
    local_338.data._M_elems[4] = local_428[4];
    local_338.data._M_elems[5] = local_428[5];
    local_338.data._M_elems[6] = local_428[6];
    local_338.data._M_elems[7] = local_428[7];
    local_338.data._M_elems[8] = local_428[8];
    local_338.data._M_elems[9] = local_428[9];
    local_338.exp = iVar15;
    local_338.neg = (bool)local_601;
    local_338.fpclass = (undefined4)local_3d8;
    local_338.prec_elem = local_3d8._4_4_;
    local_508 = local_68;
    uStack_500 = uStack_60;
    local_4f8 = local_58;
    uStack_4f0 = uStack_50;
    local_4e8 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_48;
    local_4e0 = local_40;
    local_4dc = local_3c;
    local_4d8 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                 *)local_38;
    local_548.m_backend.exp = local_78;
    local_548.m_backend.neg = (bool)local_74;
    local_548.m_backend.fpclass = local_70;
    local_548.m_backend.prec_elem = iStack_6c;
    relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
              (&local_580,(soplex *)&local_508,&local_548,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)CONCAT71((int7)((ulong)in_RCX >> 8),local_74));
    local_5f8.data._M_elems[1] = local_580.m_backend.data._M_elems[1];
    local_5f8.data._M_elems[0] = local_580.m_backend.data._M_elems[0];
    local_5f8.data._M_elems[2] = local_580.m_backend.data._M_elems[2];
    local_5f8.data._M_elems[3] = local_580.m_backend.data._M_elems[3];
    local_5f8.data._M_elems[8] = local_580.m_backend.data._M_elems[8];
    local_5f8.data._M_elems[9] = local_580.m_backend.data._M_elems[9];
    local_5f8.exp = local_580.m_backend.exp;
    local_5f8.neg = local_580.m_backend.neg;
    local_5f8.fpclass = local_580.m_backend.fpclass;
    local_5f8.prec_elem = local_580.m_backend.prec_elem;
    if ((local_580.m_backend.neg == true) &&
       (local_580.m_backend.data._M_elems[0] != 0 || local_580.m_backend.fpclass != 0)) {
      local_5f8.neg = false;
    }
    bVar12 = true;
    if ((local_580.m_backend.fpclass != 2) && (local_338.fpclass != cpp_dec_float_NaN)) {
      iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&local_5f8,&local_338);
      bVar12 = 0 < iVar15;
    }
  }
  return bVar12;
}

Assistant:

bool SPxSolverBase<R>::performSolutionPolishing()
{
   // catch rare case that the iteration limit is exactly reached at optimality
   bool stop = (maxIters >= 0 && iterations() >= maxIters && !isTimeLimitReached());

   // only polish an already optimal basis
   if(stop || polishObj == POLISH_OFF || status() != OPTIMAL)
      return false;

   int nSuccessfulPivots;
   const typename SPxBasisBase<R>::Desc& ds = this->desc();
   const typename SPxBasisBase<R>::Desc::Status* rowstatus = ds.rowStatus();
   const typename SPxBasisBase<R>::Desc::Status* colstatus = ds.colStatus();
   typename SPxBasisBase<R>::Desc::Status stat;
   SPxId polishId;
   bool success = false;

   R alloweddeviation;
   R origval = value();

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- perform solution polishing" << std::endl;)

   if(rep() == COLUMN)
   {
      setType(ENTER); // use primal simplex to preserve feasibility
      init();
      alloweddeviation = entertol();

      instableEnter = false;
      theratiotester->setType(type());

      int nrows = this->nRows();
      int ncols = this->nCols();

      assert(nrows >= 0);
      assert(ncols >= 0);

      if(polishObj == POLISH_INTEGRALITY)
      {
         DIdxSet slackcandidates(nrows);
         DIdxSet continuousvars(ncols);

         // collect nonbasic slack variables that could be made basic
         for(int i = 0; i < nrows; ++i)
         {
            // only check nonbasic rows, skip equations
            if(rowstatus[i] ==  SPxBasisBase<R>::Desc::P_ON_LOWER
                  || rowstatus[i] == SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               // only consider rows with zero dual multiplier to preserve optimality
               if(EQrel((*theCoPvec)[i], (R) 0, this->epsilon()))
                  slackcandidates.addIdx(i);
            }
         }

         // collect continuous variables that could be made basic
         if(integerVariables.size() == ncols)
         {
            for(int i = 0; i < ncols; ++i)
            {
               // skip fixed variables
               if(colstatus[i] == SPxBasisBase<R>::Desc::P_ON_LOWER
                     || colstatus[i] ==  SPxBasisBase<R>::Desc::P_ON_UPPER)
               {
                  // only consider continuous variables with zero dual multiplier to preserve optimality
                  if(EQrel(this->maxObj(i) - (*thePvec)[i], (R) 0, this->epsilon()) && integerVariables[i] == 0)
                     continuousvars.addIdx(i);
               }
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            // identify nonbasic slack variables, i.e. rows, that may be moved into the basis
            for(int i = slackcandidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               polishId = coId(slackcandidates.index(i));
               SPxOut::debug(this, "try pivoting: {} stat: {}\n", polishId, rowstatus[slackcandidates.index(i)]);
               success = enter(polishId, true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  slackcandidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // identify nonbasic variables that may be moved into the basis
            for(int i = continuousvars.size() - 1; i >= 0 && !stop; --i)
            {
               polishId = id(continuousvars.index(i));
               SPxOut::debug(this, "try pivoting: {} stat: {}\n", polishId, colstatus[continuousvars.index(i)]);
               success = enter(polishId, true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  continuousvars.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
      else
      {
         assert(polishObj == POLISH_FRACTIONALITY);
         assert(dim() >= 0);
         DIdxSet candidates(dim());

         // identify nonbasic variables, i.e. columns, that may be moved into the basis
         for(int i = 0; i < this->nCols() && !stop; ++i)
         {
            if(colstatus[i] == SPxBasisBase<R>::Desc::P_ON_LOWER
                  || colstatus[i] == SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               // only consider variables with zero reduced costs to preserve optimality
               if(EQrel(this->maxObj(i) - (*thePvec)[i], (R) 0, this->epsilon()))
                  candidates.addIdx(i);
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            for(int i = candidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               polishId = id(candidates.index(i));
               SPxOut::debug(this, "try pivoting: {} stat: {}\n", polishId, colstatus[candidates.index(i)]);
               success = enter(polishId, true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  candidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
   }
   else
   {
      setType(LEAVE); // use primal simplex to preserve feasibility
      init();
      alloweddeviation = leavetol();
      instableLeave = false;
      theratiotester->setType(type());
      bool useIntegrality = false;
      int ncols = this->nCols();

      if(integerVariables.size() == ncols)
         useIntegrality = true;

      // in ROW rep: pivot slack out of the basis
      if(polishObj == POLISH_INTEGRALITY)
      {
         assert(dim() >= 0);
         DIdxSet basiccandidates(dim());

         // collect basic candidates that may be moved out of the basis
         for(int i = 0; i < dim(); ++i)
         {
            polishId = this->baseId(i);

            if(polishId.isSPxRowId())
               stat = ds.rowStatus(this->number(polishId));
            else
            {
               // skip (integer) variables
               if(!useIntegrality || integerVariables[this->number(SPxColId(polishId))] == 1)
                  continue;

               stat = ds.colStatus(this->number(polishId));
            }

            if(stat == SPxBasisBase<R>::Desc::P_ON_LOWER || stat ==  SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               if(EQrel((*theFvec)[i], (R) 0, this->epsilon()))
                  basiccandidates.addIdx(i);
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            for(int i = basiccandidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               SPxOut::debug(this, "try pivoting: {}", this->baseId(basiccandidates.index(i)));
               success = leave(basiccandidates.index(i), true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  basiccandidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
      else
      {
         assert(polishObj == POLISH_FRACTIONALITY);
         assert(dim() >= 0);
         DIdxSet basiccandidates(dim());

         // collect basic (integer) variables, that may be moved out of the basis
         for(int i = 0; i < dim(); ++i)
         {
            polishId = this->baseId(i);

            if(polishId.isSPxRowId())
               continue;
            else
            {
               if(useIntegrality && integerVariables[this->number(SPxColId(polishId))] == 0)
                  continue;

               stat = ds.colStatus(i);
            }

            if(stat == SPxBasisBase<R>::Desc::P_ON_LOWER || stat ==  SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               if(EQrel((*theFvec)[i], (R) 0, this->epsilon()))
                  basiccandidates.addIdx(i);
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            for(int i = basiccandidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               SPxOut::debug(this, "try pivoting: {}", this->baseId(basiccandidates.index(i)));
               success = leave(basiccandidates.index(i), true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  basiccandidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
   }

   SPX_MSG_INFO1((*this->spxout),
                 (*this->spxout) << " --- finished solution polishing (" << polishCount << " pivots)" << std::endl;)

   this->setStatus(SPxBasisBase<R>::OPTIMAL);

   // if the value() changed significantly (due to numerics) reoptimize after polishing
   if(!EQrel(value(), origval, alloweddeviation))
      return true;
   else
      return false;
}